

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O3

void __thiscall Refal2::CRuleParser::afterVariableQualifier(CRuleParser *this)

{
  int *piVar1;
  string local_38;
  
  if ((this->super_CQualifierParser).token.type == TT_Word) {
    this->state = (TState)afterDirection;
    *(undefined8 *)&this->field_0x1e80 = 0;
    CFunctionBuilder::AddVariable
              ((CFunctionBuilder *)this,this->variableTypeTag,
               *(this->super_CQualifierParser).token.word._M_dataplus._M_p,&this->qualifier);
    std::__cxx11::string::erase((ulong)&(this->super_CQualifierParser).token.word,0);
    piVar1 = &(this->super_CQualifierParser).token.position;
    *piVar1 = *piVar1 + 1;
    wordAfterDirection(this);
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"missing variable name","");
  error(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CRuleParser::afterVariableQualifier()
{
	if( token.type == TT_Word ) {
		state = &CRuleParser::afterDirection;
		CFunctionBuilder::AddVariable( variableTypeTag, token.word[0],
			&qualifier );
		token.word.erase( 0, 1 );
		token.position++;
		wordAfterDirection();
	} else {
		error( "missing variable name" );
	}
}